

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O2

void slsolve(int ldm,int ncol,float *M,float *rhs)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  ulong uVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  long local_78;
  
  lVar11 = (long)ldm;
  iVar8 = ldm * 8 + 8;
  pfVar13 = rhs + 4;
  pfVar14 = M + lVar11 + 4;
  pfVar10 = M + lVar11 * 2 + 4;
  pfVar15 = M + lVar11 * 3 + 4;
  iVar16 = 4;
  local_78 = 2;
  pfVar9 = rhs;
  for (uVar12 = 0; (long)uVar12 < (long)(ncol + -7); uVar12 = uVar12 + 8) {
    fVar2 = rhs[uVar12];
    fVar17 = rhs[uVar12 + 1] - M[1] * fVar2;
    fVar19 = (rhs[uVar12 + 2] - M[2] * fVar2) - M[lVar11 + 2] * fVar17;
    fVar20 = ((rhs[uVar12 + 3] - M[3] * fVar2) - M[lVar11 + 3] * fVar17) -
             M[lVar11 * 2 + 3] * fVar19;
    fVar23 = (((rhs[uVar12 + 4] - M[4] * fVar2) - M[lVar11 + 4] * fVar17) -
             M[lVar11 * 2 + 4] * fVar19) - M[lVar11 * 3 + 4] * fVar20;
    fVar24 = ((((rhs[uVar12 + 5] - M[5] * fVar2) - M[lVar11 + 5] * fVar17) -
              M[lVar11 * 2 + 5] * fVar19) - M[lVar11 * 3 + 5] * fVar20) - M[lVar11 * 4 + 5] * fVar23
    ;
    fVar25 = (((((rhs[uVar12 + 6] - M[6] * fVar2) - M[lVar11 + 6] * fVar17) -
               M[lVar11 * 2 + 6] * fVar19) - M[lVar11 * 3 + 6] * fVar20) -
             M[lVar11 * 4 + 6] * fVar23) - M[lVar11 * 5 + 6] * fVar24;
    fVar22 = M[7];
    fVar3 = M[lVar11 + 7];
    fVar4 = M[lVar11 * 2 + 7];
    fVar18 = M[lVar11 * 3 + 7];
    fVar21 = M[lVar11 * 4 + 7];
    fVar5 = M[lVar11 * 5 + 7];
    fVar6 = M[lVar11 * 6 + 7];
    rhs[uVar12 + 1] = fVar17;
    rhs[uVar12 + 2] = fVar19;
    rhs[uVar12 + 3] = fVar20;
    rhs[uVar12 + 4] = fVar23;
    rhs[uVar12 + 5] = fVar24;
    rhs[uVar12 + 6] = fVar25;
    fVar22 = ((((((rhs[uVar12 + 7] - fVar2 * fVar22) - fVar3 * fVar17) - fVar4 * fVar19) -
               fVar18 * fVar20) - fVar21 * fVar23) - fVar5 * fVar24) - fVar6 * fVar25;
    rhs[uVar12 + 7] = fVar22;
    for (lVar7 = 8; (int)uVar12 + (int)lVar7 < ncol; lVar7 = lVar7 + 1) {
      pfVar1 = M + lVar7;
      pfVar9[lVar7] =
           pfVar1[lVar11 * 7] * -fVar22 +
           pfVar1[lVar11 * 6] * -fVar25 +
           pfVar1[lVar11 * 5] * -fVar24 +
           pfVar1[lVar11 * 4] * -fVar23 +
           pfVar1[lVar11 * 3] * -fVar20 +
           pfVar1[lVar11 * 2] * -fVar19 +
           pfVar1[lVar11] * -fVar17 + *pfVar1 * -fVar2 + pfVar9[lVar7];
    }
    M = M + iVar8;
    iVar16 = iVar16 + 8;
    local_78 = local_78 + 8;
    pfVar13 = pfVar13 + 8;
    pfVar14 = pfVar14 + iVar8;
    pfVar10 = pfVar10 + iVar8;
    pfVar15 = pfVar15 + iVar8;
    pfVar9 = pfVar9 + 8;
  }
  iVar8 = ldm * 4 + 4;
  for (; (long)uVar12 < (long)(ncol + -3); uVar12 = uVar12 + 4) {
    fVar2 = rhs[uVar12];
    fVar18 = rhs[uVar12 + 1] - M[1] * fVar2;
    fVar21 = (rhs[uVar12 + 2] - M[2] * fVar2) - M[lVar11 + 2] * fVar18;
    fVar22 = M[3];
    fVar3 = M[lVar11 + 3];
    fVar4 = M[lVar11 * 2 + 3];
    rhs[uVar12 + 1] = fVar18;
    rhs[uVar12 + 2] = fVar21;
    fVar22 = ((rhs[uVar12 + 3] - fVar2 * fVar22) - fVar3 * fVar18) - fVar4 * fVar21;
    rhs[uVar12 + 3] = fVar22;
    for (lVar7 = 0; iVar16 + (int)lVar7 < ncol; lVar7 = lVar7 + 1) {
      pfVar13[lVar7] =
           pfVar15[lVar7] * -fVar22 +
           pfVar10[lVar7] * -fVar21 +
           pfVar14[lVar7] * -fVar18 + M[lVar7 + 4] * -fVar2 + pfVar13[lVar7];
    }
    M = M + iVar8;
    iVar16 = iVar16 + 4;
    local_78 = local_78 + 4;
    pfVar13 = pfVar13 + 4;
    pfVar14 = pfVar14 + iVar8;
    pfVar10 = pfVar10 + iVar8;
    pfVar15 = pfVar15 + iVar8;
  }
  if ((int)uVar12 < ncol + -1) {
    uVar12 = uVar12 & 0xffffffff;
    fVar2 = rhs[uVar12];
    fVar22 = rhs[uVar12 + 1] - fVar2 * M[1];
    rhs[uVar12 + 1] = fVar22;
    lVar7 = 2;
    for (; local_78 < ncol; local_78 = local_78 + 1) {
      rhs[local_78] = M[lVar11 + lVar7] * -fVar22 + M[lVar7] * -fVar2 + rhs[local_78];
      lVar7 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

void slsolve ( int ldm, int ncol, float *M, float *rhs )
{
    int k;
    float x0, x1, x2, x3, x4, x5, x6, x7;
    float *M0;
    register float *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;

    M0 = &M[0];

    while ( firstcol < ncol - 7 ) { /* Do 8 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;
      Mki2 = Mki1 + ldm + 1;
      Mki3 = Mki2 + ldm + 1;
      Mki4 = Mki3 + ldm + 1;
      Mki5 = Mki4 + ldm + 1;
      Mki6 = Mki5 + ldm + 1;
      Mki7 = Mki6 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;
      x2 = rhs[firstcol+2] - x0 * *Mki0++ - x1 * *Mki1++;
      x3 = rhs[firstcol+3] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++;
      x4 = rhs[firstcol+4] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++;
      x5 = rhs[firstcol+5] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++;
      x6 = rhs[firstcol+6] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++ - x5 * *Mki5++;
      x7 = rhs[firstcol+7] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++ - x5 * *Mki5++
			   - x6 * *Mki6++;

      rhs[++firstcol] = x1;
      rhs[++firstcol] = x2;
      rhs[++firstcol] = x3;
      rhs[++firstcol] = x4;
      rhs[++firstcol] = x5;
      rhs[++firstcol] = x6;
      rhs[++firstcol] = x7;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++
	                - x2 * *Mki2++ - x3 * *Mki3++
                        - x4 * *Mki4++ - x5 * *Mki5++
			- x6 * *Mki6++ - x7 * *Mki7++;
 
      M0 += 8 * ldm + 8;
    }

    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;
      Mki2 = Mki1 + ldm + 1;
      Mki3 = Mki2 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;
      x2 = rhs[firstcol+2] - x0 * *Mki0++ - x1 * *Mki1++;
      x3 = rhs[firstcol+3] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++;

      rhs[++firstcol] = x1;
      rhs[++firstcol] = x2;
      rhs[++firstcol] = x3;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++
	                - x2 * *Mki2++ - x3 * *Mki3++;
 
      M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;

      rhs[++firstcol] = x1;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++;
 
    }
    
}